

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_next(lua_State *L,int idx)

{
  int iVar1;
  Table *t_00;
  int more;
  Table *t;
  int idx_local;
  lua_State *L_local;
  
  t_00 = gettable(L,idx);
  iVar1 = luaH_next(L,t_00,(StkId)((L->top).offset + -0x10));
  if (iVar1 == 0) {
    (L->top).p = (StkId)((L->top).offset + -0x10);
  }
  else {
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  return iVar1;
}

Assistant:

LUA_API int lua_next (lua_State *L, int idx) {
  Table *t;
  int more;
  lua_lock(L);
  api_checkpop(L, 1);
  t = gettable(L, idx);
  more = luaH_next(L, t, L->top.p - 1);
  if (more)
    api_incr_top(L);
  else  /* no more elements */
    L->top.p--;  /* pop key */
  lua_unlock(L);
  return more;
}